

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.hpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
RGB2HSI(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float r,float g,float b)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  size_type __n;
  reference pvVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  allocator<float> local_c5;
  float local_c4;
  float local_c0;
  float local_bc;
  iterator local_b8;
  size_type local_b0;
  float *local_a8;
  float *local_a0;
  float local_98;
  float local_94;
  float bn;
  float gn;
  float rn;
  float i;
  float s;
  float h;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_70;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> min;
  allocator<float> local_55;
  float local_54;
  float local_50;
  float local_4c;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> rgb;
  float b_local;
  float g_local;
  float r_local;
  
  local_48 = &local_54;
  local_40 = 3;
  local_54 = r;
  local_50 = g;
  local_4c = b;
  rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = b;
  std::allocator<float>::allocator(&local_55);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38,__l_00,&local_55);
  std::allocator<float>::~allocator(&local_55);
  local_78._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)local_38);
  _s = std::vector<float,_std::allocator<float>_>::end
                 ((vector<float,_std::allocator<float>_> *)local_38);
  local_70 = std::
             min_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                       (local_78,_s);
  i = 0.0;
  rn = 0.0;
  gn = (r + g + rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_) / 3.0;
  bn = r / (r + g + rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  local_94 = g / (r + g + rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_);
  local_98 = rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ /
             (r + g + rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
  if (0.0 < gn) {
    local_a0 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)local_38);
    local_a8 = local_70._M_current;
    __n = std::
          distance<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_a0,local_70);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_38,__n);
    rn = 1.0 - *pvVar1 / gn;
  }
  if (rn < 1e-08) {
    rn = 0.0;
  }
  if (0.0 < rn) {
    fVar2 = bn - local_94;
    fVar4 = bn - local_98;
    dVar3 = std::sqrt((double)(ulong)(uint)(fVar2 * fVar2 + fVar4 * (local_94 - local_98)));
    dVar3 = acos(((double)(fVar2 + fVar4) * 0.5) / (double)SUB84(dVar3,0));
    i = (float)dVar3;
    if (g < rgb.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_) {
      i = 6.2831855 - i;
    }
  }
  local_c4 = i;
  local_c0 = rn;
  local_bc = gn;
  local_b8 = &local_c4;
  local_b0 = 3;
  std::allocator<float>::allocator(&local_c5);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__l,&local_c5);
  std::allocator<float>::~allocator(&local_c5);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> RGB2HSI(float r, float g, float b) {
    auto rgb = std::vector<float>({r, g, b});
    auto min = std::min_element(rgb.begin(), rgb.end());

    float h = 0;
    float s = 0;
    float i = (r + g + b) / 3;

    float rn = r / (r + g + b);
    float gn = g / (r + g + b);
    float bn = b / (r + g + b);

    if (i > 0) s = 1 - (rgb[std::distance(rgb.begin(), min)] / i);
    if (s < 1e-8) s = 0;
    if (s > 0) {
        h = acos((0.5 * ((rn - gn) + (rn - bn))) / (std::sqrt((rn - gn) * (rn - gn) + (rn - bn) * (gn - bn))));
        if (b > g) h = 2 * M_PI - h;
    }
    return {h, s, i};
}